

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

VariableData * FindGlobalAt(ExpressionContext *exprCtx,uint offset)

{
  VariableData *pVVar1;
  long lVar2;
  bool bVar3;
  VariableData **ppVVar4;
  uint i;
  uint index;
  uint uVar5;
  
  index = 0;
  do {
    if ((exprCtx->variables).count <= index) {
      return (VariableData *)0x0;
    }
    ppVVar4 = SmallArray<VariableData_*,_128U>::operator[](&exprCtx->variables,index);
    pVVar1 = *ppVVar4;
    if (pVVar1->importModule == (ModuleData *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = pVVar1->importModule->importIndex;
    }
    bVar3 = IsGlobalScope(pVVar1->scope);
    if (((bVar3) && (uVar5 == offset >> 0x18)) && (pVVar1->offset <= (offset & 0xffffff))) {
      lVar2 = pVVar1->type->size;
      if (lVar2 == 0) {
        return pVVar1;
      }
      if ((long)(ulong)(offset & 0xffffff) < (long)(lVar2 + (ulong)pVVar1->offset)) {
        return pVVar1;
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

VariableData* FindGlobalAt(ExpressionContext &exprCtx, unsigned offset)
{
	unsigned targetModuleIndex = offset >> 24;

	if(targetModuleIndex)
		offset = offset & 0xffffff;

	for(unsigned i = 0; i < exprCtx.variables.size(); i++)
	{
		VariableData *variable = exprCtx.variables[i];

		unsigned variableModuleIndex = variable->importModule ? variable->importModule->importIndex : 0;

		if(IsGlobalScope(variable->scope) && variableModuleIndex == targetModuleIndex && offset >= variable->offset && (offset < variable->offset + variable->type->size || variable->type->size == 0))
			return variable;
	}

	return NULL;
}